

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O2

void __thiscall
Projection::ConvertUnew(Projection *this,MultiFab *Unew,MultiFab *Uold,Real alpha,BoxArray *grids)

{
  int *piVar1;
  Projection *this_00;
  MFIter Uoldmfi;
  
  amrex::MFIter::MFIter(&Uoldmfi,(FabArrayBase *)Uold,true);
  while (Uoldmfi.currentIndex < Uoldmfi.endIndex) {
    this_00 = (Projection *)&stack0xffffffffffffffb4;
    amrex::MFIter::growntilebox((Box *)&stack0xffffffffffffffb4,&Uoldmfi,1);
    piVar1 = &Uoldmfi.currentIndex;
    if (Uoldmfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar1 = ((Uoldmfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + Uoldmfi.currentIndex;
    }
    ConvertUnew(this_00,(Unew->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                        super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[*piVar1],
                (Uold->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
                super__Vector_impl_data._M_start[*piVar1],alpha,(Box *)&stack0xffffffffffffffb4);
    amrex::MFIter::operator++(&Uoldmfi);
  }
  amrex::MFIter::~MFIter(&Uoldmfi);
  return;
}

Assistant:

void
Projection::ConvertUnew (MultiFab&       Unew,
                         MultiFab&       Uold,
                         Real            alpha,
                         const BoxArray& grids)
{
#ifdef _OPENMP
#pragma omp parallel
#endif
  for (MFIter Uoldmfi(Uold,true); Uoldmfi.isValid(); ++Uoldmfi)
  {
        const Box& bx=Uoldmfi.growntilebox(1);
        AMREX_ASSERT(grids[Uoldmfi.index()].contains(Uoldmfi.tilebox())==true);

        ConvertUnew(Unew[Uoldmfi],Uold[Uoldmfi],alpha,bx);
  }
}